

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

pair<tsl::detail_robin_hash::robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<objc_selector*,objc_selector*const&>
          (robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,objc_selector **key,objc_selector **value_type_args)

{
  long lVar1;
  short sVar2;
  size_t ibucket_00;
  bool bVar3;
  distance_type dVar4;
  truncated_hash_type tVar5;
  value_type *key_00;
  key_type *key1;
  long lVar6;
  pair<tsl::detail_robin_hash::robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar7;
  bool local_71;
  robin_iterator<false> local_70 [3];
  bool local_51;
  robin_iterator<false> local_50;
  KeySelect local_43;
  short local_42;
  size_t sStack_40;
  distance_type dist_from_ideal_bucket;
  size_t ibucket;
  size_t hash;
  objc_selector **value_type_args_local;
  objc_selector **key_local;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *this_local;
  undefined1 local_10;
  
  hash = (size_t)value_type_args;
  value_type_args_local = key;
  key_local = (objc_selector **)this;
  ibucket = hash_key<objc_selector*>(this,key);
  sStack_40 = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              ::bucket_for_hash((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,ibucket);
  local_42 = 0;
  do {
    sVar2 = local_42;
    dVar4 = bucket_entry<objc_selector_*,_true>::dist_from_ideal_bucket
                      ((bucket_entry<objc_selector_*,_true> *)
                       (*(long *)(this + 0x20) + sStack_40 * 0x10));
    if (dVar4 < sVar2) {
      while (bVar3 = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::rehash_on_extreme_load
                               ((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)this,local_42), bVar3) {
        sStack_40 = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::bucket_for_hash((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                       *)this,ibucket);
        for (local_42 = 0; sVar2 = local_42,
            dVar4 = bucket_entry<objc_selector_*,_true>::dist_from_ideal_bucket
                              ((bucket_entry<objc_selector_*,_true> *)
                               (*(long *)(this + 0x20) + sStack_40 * 0x10)), sVar2 <= dVar4;
            local_42 = local_42 + 1) {
          sStack_40 = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                                ((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                  *)this,sStack_40);
        }
      }
      bVar3 = bucket_entry<objc_selector_*,_true>::empty
                        ((bucket_entry<objc_selector_*,_true> *)
                         (*(long *)(this + 0x20) + sStack_40 * 0x10));
      ibucket_00 = sStack_40;
      sVar2 = local_42;
      if (bVar3) {
        lVar1 = *(long *)(this + 0x20);
        lVar6 = sStack_40 * 0x10;
        tVar5 = bucket_entry<objc_selector_*,_true>::truncate_hash(ibucket);
        bucket_entry<objc_selector*,true>::set_value_of_empty_bucket<objc_selector*const&>
                  ((bucket_entry<objc_selector*,true> *)(lVar1 + lVar6),sVar2,tVar5,
                   (objc_selector **)hash);
      }
      else {
        tVar5 = bucket_entry<objc_selector_*,_true>::truncate_hash(ibucket);
        insert_value<objc_selector*const&>(this,ibucket_00,sVar2,tVar5,(objc_selector **)hash);
      }
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      ::robin_iterator<false>::robin_iterator
                (local_70,(bucket_entry_ptr)(*(long *)(this + 0x20) + sStack_40 * 0x10));
      local_71 = true;
      pVar7 = std::
              make_pair<tsl::detail_robin_hash::robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::robin_iterator<false>,bool>
                        (local_70,&local_71);
      local_10 = pVar7.second;
LAB_001340a5:
      this_local = (robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *)pVar7.first.m_bucket;
      pVar7.second = (bool)local_10;
      pVar7.first.m_bucket = (bucket_entry_ptr)this_local;
      return pVar7;
    }
    key_00 = bucket_entry<objc_selector_*,_true>::value
                       ((bucket_entry<objc_selector_*,_true> *)
                        (*(long *)(this + 0x20) + sStack_40 * 0x10));
    key1 = robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           ::KeySelect::operator()(&local_43,key_00);
    bVar3 = compare_keys<objc_selector*,objc_selector*>(this,key1,value_type_args_local);
    if (bVar3) {
      robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
      ::robin_iterator<false>::robin_iterator
                (&local_50,(bucket_entry_ptr)(*(long *)(this + 0x20) + sStack_40 * 0x10));
      local_51 = false;
      pVar7 = std::
              make_pair<tsl::detail_robin_hash::robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::robin_iterator<false>,bool>
                        (&local_50,&local_51);
      local_10 = pVar7.second;
      goto LAB_001340a5;
    }
    sStack_40 = robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                ::next_bucket<tsl::rh::power_of_two_growth_policy<2UL>,_nullptr>
                          ((robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                            *)this,sStack_40);
    local_42 = local_42 + 1;
  } while( true );
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }